

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

void Cmd_End(Abc_Frame_t *pAbc)

{
  int iVar1;
  Abc_Command *local_28;
  char *pValue;
  char *pKey;
  st__generator *gen;
  Abc_Frame_t *pAbc_local;
  
  gen = (st__generator *)pAbc;
  Cmd_HistoryWrite(pAbc,1000000000);
  pKey = (char *)st__init_gen(*(st__table **)&gen->index);
  while (iVar1 = st__gen((st__generator *)pKey,&pValue,(char **)&local_28), iVar1 != 0) {
    CmdCommandFree(local_28);
  }
  st__free_gen((st__generator *)pKey);
  st__free_table(*(st__table **)&gen->index);
  pKey = (char *)st__init_gen(gen[1].table);
  while (iVar1 = st__gen((st__generator *)pKey,&pValue,(char **)&local_28), iVar1 != 0) {
    CmdCommandAliasFree((Abc_Alias *)local_28);
  }
  st__free_gen((st__generator *)pKey);
  st__free_table(gen[1].table);
  pKey = (char *)st__init_gen((st__table *)gen[1].entry);
  while (iVar1 = st__gen((st__generator *)pKey,&pValue,(char **)&local_28), iVar1 != 0) {
    if (pValue != (char *)0x0) {
      free(pValue);
      pValue = (char *)0x0;
    }
    if (local_28 != (Abc_Command *)0x0) {
      free(local_28);
      local_28 = (Abc_Command *)0x0;
    }
  }
  st__free_gen((st__generator *)pKey);
  st__free_table((st__table *)gen[1].entry);
  Vec_PtrFreeFree(*(Vec_Ptr_t **)&gen[1].index);
  return;
}

Assistant:

void Cmd_End( Abc_Frame_t * pAbc )
{
    st__generator * gen;
    char * pKey, * pValue;
    Cmd_HistoryWrite( pAbc, ABC_INFINITY );

//    st__free_table( pAbc->tCommands, (void (*)()) 0, CmdCommandFree );
//    st__free_table( pAbc->tAliases,  (void (*)()) 0, CmdCommandAliasFree );
//    st__free_table( pAbc->tFlags,    free, free );

    st__foreach_item( pAbc->tCommands, gen, (const char **)&pKey, (char **)&pValue )
        CmdCommandFree( (Abc_Command *)pValue );
    st__free_table( pAbc->tCommands );

    st__foreach_item( pAbc->tAliases, gen, (const char **)&pKey, (char **)&pValue )
        CmdCommandAliasFree( (Abc_Alias *)pValue );
    st__free_table( pAbc->tAliases );

    st__foreach_item( pAbc->tFlags, gen, (const char **)&pKey, (char **)&pValue )
        ABC_FREE( pKey ), ABC_FREE( pValue );
    st__free_table( pAbc->tFlags );

    Vec_PtrFreeFree( pAbc->aHistory );
}